

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigInteger.cpp
# Opt level: O1

void xercesc_4_0::XMLBigInteger::parseBigInteger
               (XMLCh *toConvert,XMLCh *retBuffer,int *signValue,MemoryManager *manager)

{
  short *psVar1;
  XMLCh XVar2;
  NumberFormatException *this;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  long lVar5;
  XMLCh *pXVar6;
  long lVar7;
  
  if ((toConvert == (XMLCh *)0x0) || (*toConvert == L'\0')) {
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
               ,0x68,XMLNUM_emptyString,manager);
LAB_00251b5e:
    __cxa_throw(this,&NumberFormatException::typeinfo,XMLException::~XMLException);
  }
  lVar5 = 0;
  pXVar6 = toConvert;
  do {
    pXVar4 = pXVar6;
    XVar2 = *pXVar4;
    lVar5 = lVar5 + 2;
    pXVar6 = pXVar4 + 1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar2] < '\0');
  if (XVar2 == L'\0') {
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
               ,0x76,XMLNUM_WSString,manager);
    goto LAB_00251b5e;
  }
  lVar7 = 0;
  do {
    psVar1 = (short *)((long)toConvert + lVar7);
    lVar7 = lVar7 + 2;
  } while (*psVar1 != 0);
  pXVar6 = (XMLCh *)((long)toConvert + lVar7);
  lVar5 = lVar5 - lVar7;
  do {
    pXVar3 = pXVar6 + -2;
    lVar5 = lVar5 + 2;
    pXVar6 = pXVar6 + -1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar3] < '\0');
  *signValue = 1;
  if (XVar2 == L'+') {
    if (lVar5 == 0) {
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                 ,0x96,XMLNUM_Inv_chars,manager);
      goto LAB_00251b5e;
    }
  }
  else {
    if (XVar2 != L'-') goto LAB_00251ae0;
    *signValue = -1;
    if (lVar5 == 0) {
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                 ,0x8d,XMLNUM_Inv_chars,manager);
      goto LAB_00251b5e;
    }
  }
  pXVar4 = pXVar4 + 1;
LAB_00251ae0:
  do {
    pXVar3 = pXVar4;
    pXVar4 = pXVar3 + 1;
  } while (*pXVar3 == L'0');
  if (pXVar3 < pXVar6) {
    lVar5 = -2;
    do {
      lVar7 = lVar5;
      if ((ushort)(*(short *)((long)pXVar4 + lVar7) - 0x3aU) < 0xfff6) {
        this = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                   ,0xab,XMLNUM_Inv_chars,manager);
        goto LAB_00251b5e;
      }
      *(short *)((long)retBuffer + lVar7 + 2) = *(short *)((long)pXVar4 + lVar7);
      lVar5 = lVar7 + 2;
    } while ((XMLCh *)((long)pXVar4 + lVar7 + 2) < pXVar6);
    *(undefined2 *)((long)retBuffer + lVar7 + 4) = 0;
  }
  else {
    *signValue = 0;
  }
  return;
}

Assistant:

void XMLBigInteger::parseBigInteger(const XMLCh* const toConvert
                                  , XMLCh* const retBuffer
                                  , int&   signValue
                                  , MemoryManager* const manager)
{
    // If no string, then its a failure
    if ((!toConvert) || (!*toConvert))
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, manager);

    //
    // Note: in Java's BigInteger, it seems any leading and/or trailing
    // whitespaces are not allowed. If this is the case, we may
    // need to skip the trimming below.
    //

    // Scan past any whitespace. If we hit the end, then return failure
    const XMLCh* startPtr = toConvert;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Start at the end and work back through any whitespace
    const XMLCh* endPtr = toConvert + XMLString::stringLen(toConvert);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    //
    //  Work through what remains and convert each char to a digit.
    //  anything other than '
    //
    XMLCh* retPtr = retBuffer;
    signValue = 1;

    //
    // '+' or '-' is allowed only at the first position
    //
    if (*startPtr == chDash)
    {
        signValue = -1;
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        // skip the '+'
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }


    // Scan past any leading zero.
    while (*startPtr == chDigit_0)
        startPtr++;

    if (startPtr >= endPtr)
    {
        signValue = 0;
        // containning zero, only zero, nothing but zero
        // it is a zero, indeed
        return;
    }

    while (startPtr < endPtr)
    {
        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        // copy over
        *retPtr = *startPtr;
        retPtr++;
        startPtr++;
    }

    *retPtr = 0;   //terminated
    return;
}